

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmFunctionCall(ExpressionContext *ctx,VmModule *module,ExprFunctionCall *node)

{
  VmValueType VVar1;
  VmInstructionType cmd;
  TypeBase *pTVar2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  VariableData *pVVar5;
  VmConstant **ppVVar6;
  bool bVar7;
  int iVar8;
  VmValue *argument;
  VmConstant *pVVar9;
  undefined4 extraout_var;
  VmInstruction *argument_00;
  VmInstruction *this;
  ExprBase *pEVar10;
  VmInstruction *argument_01;
  VmValue *pVVar11;
  uint uVar12;
  VmValue *argument_02;
  VmType VVar13;
  undefined4 extraout_var_00;
  
  argument = CompileVm(ctx,module,node->function);
  if (module->currentBlock == (VmBlock *)0x0) {
    __assert_fail("module->currentBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe7d,
                  "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
                 );
  }
  pTVar2 = (node->super_ExprBase).type;
  if (pTVar2->size < 0x41) {
    argument_00 = (VmInstruction *)CreateConstantInt(ctx->allocator,(node->super_ExprBase).source,0)
    ;
  }
  else {
    pVVar9 = anon_unknown.dwarf_107107::CreateAlloca
                       (ctx,module,(node->super_ExprBase).source,pTVar2,"spill",true);
    iVar8 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
    argument_00 = (VmInstruction *)CONCAT44(extraout_var,iVar8);
    pAVar3 = ctx->allocator;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pSVar4 = (node->super_ExprBase).source;
    (argument_00->super_VmValue).typeID = 1;
    (argument_00->super_VmValue).type = VVar13;
    (argument_00->super_VmValue).source = pSVar4;
    (argument_00->super_VmValue).comment.begin = (char *)0x0;
    (argument_00->super_VmValue).comment.end = (char *)0x0;
    (argument_00->super_VmValue).users.allocator = pAVar3;
    (argument_00->super_VmValue).users.data = (argument_00->super_VmValue).users.little;
    (argument_00->super_VmValue).users.count = 0;
    (argument_00->super_VmValue).users.max = 8;
    (argument_00->super_VmValue).hasKnownNonSimpleUse = false;
    (argument_00->super_VmValue).hasSideEffects = false;
    (argument_00->super_VmValue).hasMemoryAccess = false;
    (argument_00->super_VmValue).canBeRemoved = true;
    (argument_00->super_VmValue).hasKnownSimpleUse = false;
    (argument_00->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00224d48;
    argument_00->cmd = VM_INST_LOAD_BYTE;
    (argument_00->arguments).little[2] = (VmValue *)0x0;
    (argument_00->arguments).little[3] = (VmValue *)0x0;
    (argument_00->arguments).little[0] = (VmValue *)0x0;
    (argument_00->arguments).little[1] = (VmValue *)0x0;
    (argument_00->arguments).data = (VmValue **)0x0;
    (argument_00->arguments).count = 0;
    (argument_00->arguments).max = 0;
    *(undefined2 *)&(argument_00->arguments).allocator = 0;
    argument_00->cmd = pVVar9->iValue;
    pVVar5 = pVVar9->container;
    (argument_00->arguments).little[3] = (VmValue *)pVVar5;
    *(bool *)((long)&(argument_00->arguments).allocator + 1) = true;
    uVar12 = (pVVar5->users).count;
    if (uVar12 == (pVVar5->users).max) {
      SmallArray<VmConstant_*,_8U>::grow(&pVVar5->users,uVar12);
    }
    ppVVar6 = (pVVar5->users).data;
    if (ppVVar6 == (VmConstant **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                   );
    }
    uVar12 = (pVVar5->users).count;
    (pVVar5->users).count = uVar12 + 1;
    ppVVar6[uVar12] = (VmConstant *)argument_00;
  }
  iVar8 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x138);
  this = (VmInstruction *)CONCAT44(extraout_var_00,iVar8);
  pAVar3 = module->allocator;
  VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
  pSVar4 = (node->super_ExprBase).source;
  uVar12 = module->currentFunction->nextInstructionId;
  module->currentFunction->nextInstructionId = uVar12 + 1;
  (this->super_VmValue).typeID = 2;
  (this->super_VmValue).type = VVar13;
  (this->super_VmValue).source = pSVar4;
  (this->super_VmValue).comment.begin = (char *)0x0;
  (this->super_VmValue).comment.end = (char *)0x0;
  (this->super_VmValue).users.allocator = pAVar3;
  (this->super_VmValue).users.data = (this->super_VmValue).users.little;
  (this->super_VmValue).users.count = 0;
  (this->super_VmValue).users.max = 8;
  (this->super_VmValue).hasKnownNonSimpleUse = false;
  (this->super_VmValue).hasSideEffects = false;
  (this->super_VmValue).hasMemoryAccess = false;
  (this->super_VmValue).canBeRemoved = true;
  (this->super_VmValue).hasKnownSimpleUse = false;
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmInstruction_00224cd8;
  this->cmd = VM_INST_CALL;
  this->uniqueId = uVar12;
  (this->arguments).allocator = pAVar3;
  (this->arguments).data = (this->arguments).little;
  (this->arguments).count = 0;
  (this->arguments).max = 4;
  (this->regVmRegisters).allocator = pAVar3;
  (this->regVmRegisters).data = (this->regVmRegisters).little;
  (this->regVmRegisters).max = 8;
  (this->regVmRegisters).count = 0;
  this->parent = (VmBlock *)0x0;
  this->prevSibling = (VmInstruction *)0x0;
  *(undefined8 *)((long)&this->prevSibling + 1) = 0;
  *(undefined8 *)((long)&this->nextSibling + 1) = 0;
  this->regVmCompletedUsers = 0;
  this->regVmSearchMarker = 0;
  this->color = 0;
  this->marker = 0;
  this->idom = (VmInstruction *)0x0;
  this->intersectingIdom = (VmInstruction *)0x0;
  if ((((argument == (VmValue *)0x0) || (argument->typeID != 2)) ||
      (*(int *)&argument[1]._vptr_VmValue != 0x49)) ||
     ((argument->type).type != VM_TYPE_FUNCTION_REF)) {
    pVVar11 = (VmValue *)0x0;
    argument_02 = (VmValue *)0x0;
  }
  else {
    VVar1 = argument[1].type.type;
    if ((VVar1 == VM_TYPE_VOID) || (VVar1 == VM_TYPE_INT)) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    argument_02 = (VmValue *)**(undefined8 **)&argument[1].typeID;
    pVVar11 = (VmValue *)(*(undefined8 **)&argument[1].typeID)[1];
    if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 4)) {
      pVVar11 = (VmValue *)0x0;
    }
  }
  pEVar10 = (node->arguments).head;
  if (pEVar10 != (ExprBase *)0x0) {
    uVar12 = (pVVar11 != (VmValue *)0x0 && argument_02 != (VmValue *)0x0) | 2;
    do {
      uVar12 = uVar12 + 1;
      pEVar10 = pEVar10->next;
    } while (pEVar10 != (ExprBase *)0x0);
    if (3 < uVar12) {
      SmallArray<VmValue_*,_4U>::grow(&this->arguments,uVar12);
    }
  }
  if (pVVar11 != (VmValue *)0x0 && argument_02 != (VmValue *)0x0) {
    VmInstruction::AddArgument(this,argument_02);
    argument = pVVar11;
  }
  VmInstruction::AddArgument(this,argument);
  VmInstruction::AddArgument(this,&argument_00->super_VmValue);
  pEVar10 = (node->arguments).head;
  while( true ) {
    if (pEVar10 == (ExprBase *)0x0) {
      cmd = this->cmd;
      bVar7 = anon_unknown.dwarf_107107::HasSideEffects(cmd);
      (this->super_VmValue).hasSideEffects = bVar7;
      bVar7 = anon_unknown.dwarf_107107::HasMemoryAccess(cmd);
      (this->super_VmValue).hasMemoryAccess = bVar7;
      VmBlock::AddInstruction(module->currentBlock,this);
      pTVar2 = (node->super_ExprBase).type;
      if (0x40 < pTVar2->size) {
        this = argument_00;
      }
      anon_unknown.dwarf_107107::CheckType(ctx,(ExprBase *)pTVar2,&this->super_VmValue);
      return &this->super_VmValue;
    }
    argument_01 = (VmInstruction *)CompileVm(ctx,module,pEVar10);
    if ((argument_01->super_VmValue).type.size == 0 &&
        (argument_01->super_VmValue).type.type == VM_TYPE_VOID) break;
    if (pEVar10->type == ctx->typeFloat) {
      argument_01 = anon_unknown.dwarf_107107::CreateInstruction
                              ((anon_unknown_dwarf_107107 *)module,
                               (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                               (VmType)(ZEXT816(0x11) << 0x40),(VmInstructionType)argument_01,
                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                               &argument_00->super_VmValue);
    }
    VmInstruction::AddArgument(this,&argument_01->super_VmValue);
    pEVar10 = pEVar10->next;
  }
  __assert_fail("argument->type != VmType::Void",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xebd,
                "VmValue *CompileVmFunctionCall(ExpressionContext &, VmModule *, ExprFunctionCall *)"
               );
}

Assistant:

VmValue* CompileVmFunctionCall(ExpressionContext &ctx, VmModule *module, ExprFunctionCall *node)
{
	VmValue *function = CompileVm(ctx, module, node->function);

	assert(module->currentBlock);

	VmValue *resultTarget = NULL;

	if(node->type->size > spillTypeSize)
	{
		VmConstant *spill = CreateAlloca(ctx, module, node->source, node->type, "spill", true);

		VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, node->type), node->source);

		reference->iValue = spill->iValue;
		reference->container = spill->container;
		reference->isReference = true;

		reference->container->users.push_back(reference);

		resultTarget = reference;
	}
	else
	{
		resultTarget = CreateConstantInt(ctx.allocator, node->source, 0);
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_CALL, module->currentFunction->nextInstructionId++);

	// Inline call target for instruction without context
	VmValue *functionContext = NULL;
	VmFunction *functionId = NULL;

	if(VmInstruction *target = getType<VmInstruction>(function))
	{
		if(target->cmd == VM_INST_CONSTRUCT && target->type.type == VM_TYPE_FUNCTION_REF)
		{
			functionContext = target->arguments[0];
			functionId = getType<VmFunction>(target->arguments[1]);
		}
	}

	unsigned argCount = 2;

	if(functionContext && functionId)
		argCount++;

	for(ExprBase *value = node->arguments.head; value; value = value->next)
		argCount++;

	inst->arguments.reserve(argCount);

	if(functionContext && functionId)
	{
		inst->AddArgument(functionContext);
		inst->AddArgument(functionId);
	}
	else
	{
		inst->AddArgument(function);
	}

	inst->AddArgument(resultTarget);

	for(ExprBase *value = node->arguments.head; value; value = value->next)
	{
		VmValue *argument = CompileVm(ctx, module, value);

		assert(argument->type != VmType::Void);

		if(value->type == ctx.typeFloat)
			argument = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, argument);

		inst->AddArgument(argument);
	}

	inst->hasSideEffects = HasSideEffects(inst->cmd);
	inst->hasMemoryAccess = HasMemoryAccess(inst->cmd);

	module->currentBlock->AddInstruction(inst);

	if(node->type->size > spillTypeSize)
		return CheckType(ctx, node, resultTarget);

	return CheckType(ctx, node, inst);
}